

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::Begin
          (ByteCodeGenerator *this,ArenaAllocator *alloc,uint32 grfscr,
          ParseableFunctionInfo *pRootFunc)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *pSVar4;
  DListNode<JumpCleanupInfo> *pDVar5;
  
  this->alloc = alloc;
  this->flags = grfscr;
  this->pRootFunc = pRootFunc;
  if (pRootFunc == (ParseableFunctionInfo *)0x0) {
    pRootFunc = (ParseableFunctionInfo *)0x0;
  }
  else {
    bVar2 = Js::FunctionProxy::IsFunctionBody(&pRootFunc->super_FunctionProxy);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  this->pCurrentFunction = (FunctionBody *)pRootFunc;
  if (((FunctionBody *)pRootFunc != (FunctionBody *)0x0) &&
     (((((FunctionBody *)pRootFunc)->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 &
      0x10) != 0)) {
    bVar2 = Js::ScriptContext::IsScriptContextInNonDebugMode(this->scriptContext);
    if ((bVar2) || ((this->m_utf8SourceInfo->field_0xa8 & 4) != 0)) {
      this->pCurrentFunction = (FunctionBody *)0x0;
    }
  }
  this->currentBlock = (ParseNodeBlock *)0x0;
  this->currentScope = (Scope *)0x0;
  this->globalScope = (Scope *)0x0;
  this->isBinding = true;
  this->inPrologue = false;
  this->maxAstSize = 0;
  this->loopDepth = 0;
  this->envDepth = 0;
  this->trackEnvDepth = false;
  this->funcEscapes = false;
  this->funcInfosToFinalize = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  pSVar4 = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
           new<Memory::ArenaAllocator>(0x18,alloc,0x366bee);
  (pSVar4->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count = 0
  ;
  (pSVar4->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar4;
  pSVar4->allocator = alloc;
  this->funcInfoStack = pSVar4;
  pDVar5 = (DListNode<JumpCleanupInfo> *)new<Memory::ArenaAllocator>(0x20,alloc,0x366bee);
  ((RealCount *)&pDVar5->data)->count = 0;
  (((DListBase<JumpCleanupInfo,_RealCount> *)&pDVar5->super_DListNodeBase<JumpCleanupInfo>)->
  super_DListNodeBase<JumpCleanupInfo>).next.list = (DListBase<JumpCleanupInfo,_RealCount> *)pDVar5;
  (((DListBase<JumpCleanupInfo,_RealCount> *)&pDVar5->super_DListNodeBase<JumpCleanupInfo>)->
  super_DListNodeBase<JumpCleanupInfo>).prev.node = pDVar5;
  *(ArenaAllocator **)&(pDVar5->data).loopId = alloc;
  this->jumpCleanupList = (JumpCleanupList *)pDVar5;
  return;
}

Assistant:

void ByteCodeGenerator::Begin(
    __in ArenaAllocator *alloc,
    __in uint32 grfscr,
    __in Js::ParseableFunctionInfo* pRootFunc)
{
    this->alloc = alloc;
    this->flags = grfscr;
    this->pRootFunc = pRootFunc;
    this->pCurrentFunction = pRootFunc ? pRootFunc->GetFunctionBody() : nullptr;
    if (this->pCurrentFunction && this->pCurrentFunction->GetIsGlobalFunc() && IsInNonDebugMode())
    {
        // This is the deferred parse case (not due to debug mode), in which case the global function will not be marked to compiled again.
        this->pCurrentFunction = nullptr;
    }

    this->globalScope = nullptr;
    this->currentScope = nullptr;
    this->currentBlock = nullptr;
    this->isBinding = true;
    this->inPrologue = false;
    this->funcEscapes = false;
    this->maxAstSize = 0;
    this->loopDepth = 0;
    this->envDepth = 0;
    this->trackEnvDepth = false;
    this->funcInfosToFinalize = nullptr;

    this->funcInfoStack = Anew(alloc, SList<FuncInfo*>, alloc);
    this->jumpCleanupList = Anew(alloc, JumpCleanupList, alloc);
}